

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  pointer pIVar2;
  undefined8 uVar3;
  byte *pbVar4;
  size_type sVar5;
  long lVar6;
  
  sVar5 = this->len;
  if (sVar5 == 0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    pbVar4 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar4 + sVar5 * 0x18) {
      pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar5 * 0x18,8);
      sVar5 = this->len;
      if (sVar5 == 0) goto LAB_0039f87a;
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar4 + sVar5 * 0x18;
    }
    pIVar2 = this->data_;
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pIVar2->expressions).data_ + lVar6);
      *(undefined8 *)(pbVar4 + lVar6 + 0x10) = puVar1[2];
      uVar3 = puVar1[1];
      *(undefined8 *)(pbVar4 + lVar6) = *puVar1;
      *(undefined8 *)(pbVar4 + lVar6 + 8) = uVar3;
      lVar6 = lVar6 + 0x18;
    } while ((pointer)(puVar1 + 3) != pIVar2 + sVar5);
    if (this->len != 0 && pbVar4 == (byte *)0x0) {
      std::terminate();
    }
  }
LAB_0039f87a:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }